

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O0

void __thiscall OpenMD::VectorAccumulator::VectorAccumulator(VectorAccumulator *this)

{
  BaseAccumulator *in_RDI;
  
  in_RDI->_vptr_BaseAccumulator = (_func_int **)0x0;
  in_RDI->Count_ = 0;
  BaseAccumulator::BaseAccumulator(in_RDI);
  in_RDI->_vptr_BaseAccumulator = (_func_int **)&PTR_clear_00502c60;
  Vector3<double>::Vector3((Vector3<double> *)0x2f9bb6);
  Vector3<double>::Vector3((Vector3<double> *)0x2f9bc6);
  Vector3<double>::Vector3((Vector3<double> *)0x2f9bd6);
  Vector3<double>::Vector3((Vector3<double> *)0x2f9be6);
  (**in_RDI->_vptr_BaseAccumulator)();
  return;
}

Assistant:

VectorAccumulator() : BaseAccumulator() { this->clear(); }